

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::
Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_chaiscript::Function_Params_&)>::
Dynamic_Proxy_Function_Impl
          (Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_chaiscript::Function_Params_&)>
           *this,_func_Boxed_Value_Function_Params_ptr *t_f,int t_arity,
          shared_ptr<chaiscript::AST_Node> *t_parsenode,Param_Types *t_param_types,
          Proxy_Function *t_guard)

{
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_78;
  Param_Types local_68;
  shared_ptr<chaiscript::AST_Node> local_48;
  Proxy_Function *local_38;
  Proxy_Function *t_guard_local;
  Param_Types *t_param_types_local;
  shared_ptr<chaiscript::AST_Node> *t_parsenode_local;
  _func_Boxed_Value_Function_Params_ptr *p_Stack_18;
  int t_arity_local;
  _func_Boxed_Value_Function_Params_ptr *t_f_local;
  Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_chaiscript::Function_Params_&)>
  *this_local;
  
  local_38 = t_guard;
  t_guard_local = (Proxy_Function *)t_param_types;
  t_param_types_local = (Param_Types *)t_parsenode;
  t_parsenode_local._4_4_ = t_arity;
  p_Stack_18 = t_f;
  t_f_local = (_func_Boxed_Value_Function_Params_ptr *)this;
  std::shared_ptr<chaiscript::AST_Node>::shared_ptr(&local_48,t_parsenode);
  Param_Types::Param_Types(&local_68,t_param_types);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::shared_ptr(&local_78,t_guard);
  Dynamic_Proxy_Function::Dynamic_Proxy_Function
            (&this->super_Dynamic_Proxy_Function,t_arity,&local_48,&local_68,&local_78);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_78);
  Param_Types::~Param_Types(&local_68);
  std::shared_ptr<chaiscript::AST_Node>::~shared_ptr(&local_48);
  (this->super_Dynamic_Proxy_Function).super_Proxy_Function_Base._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Dynamic_Proxy_Function_Impl_00825f60;
  this->m_f = p_Stack_18;
  return;
}

Assistant:

Dynamic_Proxy_Function_Impl(Callable t_f,
                                  int t_arity = -1,
                                  std::shared_ptr<AST_Node> t_parsenode = AST_NodePtr(),
                                  Param_Types t_param_types = Param_Types(),
                                  Proxy_Function t_guard = Proxy_Function())
          : Dynamic_Proxy_Function(t_arity, std::move(t_parsenode), std::move(t_param_types), std::move(t_guard))
          , m_f(std::move(t_f)) {
      }